

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

LinearSpace3fa * __thiscall
embree::avx512::LineSegmentsISA::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,LineSegmentsISA *this,size_t primID,
          BBox1f time_range)

{
  BBox1f BVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  undefined1 in_register_00001208 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar20;
  float fVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 local_28 [16];
  
  auVar12._8_56_ = in_register_00001208;
  auVar12._0_8_ = time_range;
  BVar1 = (this->super_LineSegments).super_Geometry.time_range;
  auVar13._8_8_ = 0;
  auVar13._0_4_ = BVar1.lower;
  auVar13._4_4_ = BVar1.upper;
  fVar22 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
  fVar20 = BVar1.lower;
  auVar13 = vmovshdup_avx(auVar13);
  fVar17 = auVar13._0_4_ - fVar20;
  auVar9 = vmovshdup_avx(auVar12._0_16_);
  auVar13 = ZEXT416((uint)(fVar22 * ((time_range.lower - fVar20) / fVar17) * 1.0000002));
  auVar13 = vroundss_avx(auVar13,auVar13,9);
  auVar13 = vmaxss_avx(ZEXT816(0),auVar13);
  auVar9 = ZEXT416((uint)(fVar22 * ((auVar9._0_4_ - fVar20) / fVar17) * 0.99999976));
  auVar9 = vroundss_avx(auVar9,auVar9,10);
  auVar9 = vminss_avx(auVar9,ZEXT416((uint)fVar22));
  if ((int)auVar9._0_4_ == (int)auVar13._0_4_) {
    auVar13 = vdpps_avx(_DAT_020214e0,_DAT_020214e0,0x7f);
    auVar8 = SUB6416(ZEXT464(0xbf800000),0);
    auVar9 = vdpps_avx(auVar8,auVar8,0x7f);
    uVar2 = vcmpps_avx512vl(auVar9,auVar13,1);
    auVar13 = vpmovm2d_avx512vl(uVar2);
    auVar14._0_4_ = auVar13._0_4_;
    auVar14._4_4_ = auVar14._0_4_;
    auVar14._8_4_ = auVar14._0_4_;
    auVar14._12_4_ = auVar14._0_4_;
    uVar6 = vpmovd2m_avx512vl(auVar14);
    auVar13 = vpcmpeqd_avx(auVar14,auVar14);
    auVar7._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar13._4_4_;
    auVar7._0_4_ = (uint)((byte)uVar6 & 1) * auVar13._0_4_;
    auVar7._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar13._8_4_;
    auVar7._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar13._12_4_;
    auVar5._12_4_ = 0;
    auVar5._0_12_ = ZEXT812(0);
    auVar13 = vblendvps_avx(auVar8,_DAT_020214e0,auVar7);
    auVar9 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar8 = vrsqrt14ss_avx512f(auVar5 << 0x20,ZEXT416((uint)auVar9._0_4_));
    fVar22 = auVar8._0_4_;
    fVar22 = fVar22 * 1.5 + auVar9._0_4_ * -0.5 * fVar22 * fVar22 * fVar22;
    aVar15._0_4_ = auVar13._0_4_ * fVar22;
    aVar15._4_4_ = auVar13._4_4_ * fVar22;
    aVar15._8_4_ = auVar13._8_4_ * fVar22;
    aVar15._12_4_ = auVar13._12_4_ * fVar22;
    auVar13 = vshufps_avx((undefined1  [16])aVar15,(undefined1  [16])aVar15,0xc9);
    auVar18._0_4_ = aVar15._0_4_ * -0.0;
    auVar18._4_4_ = aVar15._4_4_ * -1.0;
    auVar18._8_4_ = aVar15._8_4_ * -0.0;
    auVar18._12_4_ = aVar15._12_4_ * -0.0;
    auVar13 = vfmadd231ps_fma(auVar18,(undefined1  [16])_DAT_01fec700,auVar13);
    aVar11 = _DAT_01fec700;
  }
  else {
    (*(this->super_LineSegments).super_Geometry.super_RefCount._vptr_RefCount[0x38])
              (local_28,this,primID,(long)(((int)auVar13._0_4_ + (int)auVar9._0_4_) / 2));
    auVar13 = vdpps_avx(local_28,local_28,0x7f);
    auVar4 = ZEXT812(0) << 0x20;
    auVar16 = ZEXT816(0) << 0x40;
    auVar23._4_12_ = auVar4;
    auVar23._0_4_ = auVar13._0_4_;
    auVar9 = vrsqrt14ss_avx512f(auVar16,auVar23);
    fVar22 = auVar9._0_4_;
    fVar22 = fVar22 * 1.5 + auVar13._0_4_ * -0.5 * fVar22 * fVar22 * fVar22;
    aVar11._0_4_ = local_28._0_4_ * fVar22;
    aVar11._4_4_ = local_28._4_4_ * fVar22;
    aVar11._8_4_ = local_28._8_4_ * fVar22;
    aVar11._12_4_ = local_28._12_4_ * fVar22;
    auVar9._8_4_ = 0xff7fffff;
    auVar9._0_8_ = 0xff7fffffff7fffff;
    auVar9._12_4_ = 0xff7fffff;
    uVar2 = vcmpps_avx512vl((undefined1  [16])aVar11,auVar9,5);
    auVar8._8_4_ = 0x7f7fffff;
    auVar8._0_8_ = 0x7f7fffff7f7fffff;
    auVar8._12_4_ = 0x7f7fffff;
    uVar3 = vcmpps_avx512vl((undefined1  [16])aVar11,auVar8,2);
    if ((~((ushort)uVar2 & (ushort)uVar3) & 7) != 0) {
      fVar17 = 0.0;
      fVar20 = 1.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      aVar15 = SUB6416(ZEXT464(0x3f800000),0);
      aVar11 = _DAT_01fec700;
      goto LAB_01fb20da;
    }
    auVar9 = vshufpd_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,1);
    auVar13 = vmovshdup_avx((undefined1  [16])aVar11);
    auVar25._8_4_ = 0x80000000;
    auVar25._0_8_ = 0x8000000080000000;
    auVar25._12_4_ = 0x80000000;
    auVar24._0_4_ = auVar13._0_4_ ^ 0x80000000;
    auVar13 = vunpckhps_avx((undefined1  [16])aVar11,auVar16);
    auVar24._4_12_ = auVar4;
    auVar23 = vshufps_avx(auVar13,auVar24,0x41);
    auVar13 = vdpps_avx(auVar23,auVar23,0x7f);
    auVar19._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
    auVar19._8_8_ = auVar9._8_8_ ^ auVar25._8_8_;
    auVar8 = vinsertps_avx(auVar19,(undefined1  [16])aVar11,0x2a);
    auVar9 = vdpps_avx(auVar8,auVar8,0x7f);
    uVar2 = vcmpps_avx512vl(auVar9,auVar13,1);
    auVar13 = vpmovm2d_avx512vl(uVar2);
    auVar26._0_4_ = auVar13._0_4_;
    auVar26._4_4_ = auVar26._0_4_;
    auVar26._8_4_ = auVar26._0_4_;
    auVar26._12_4_ = auVar26._0_4_;
    uVar6 = vpmovd2m_avx512vl(auVar26);
    auVar13 = vpcmpeqd_avx(auVar26,auVar26);
    auVar10._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar13._4_4_;
    auVar10._0_4_ = (uint)((byte)uVar6 & 1) * auVar13._0_4_;
    auVar10._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar13._8_4_;
    auVar10._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar13._12_4_;
    auVar13 = vblendvps_avx(auVar8,auVar23,auVar10);
    auVar9 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar27._4_12_ = auVar4;
    auVar27._0_4_ = auVar9._0_4_;
    auVar8 = vrsqrt14ss_avx512f(auVar16,auVar27);
    fVar22 = auVar8._0_4_;
    fVar22 = fVar22 * 1.5 + auVar9._0_4_ * -0.5 * fVar22 * fVar22 * fVar22;
    aVar15._0_4_ = auVar13._0_4_ * fVar22;
    aVar15._4_4_ = auVar13._4_4_ * fVar22;
    aVar15._8_4_ = auVar13._8_4_ * fVar22;
    aVar15._12_4_ = auVar13._12_4_ * fVar22;
    auVar13 = vshufps_avx((undefined1  [16])aVar15,(undefined1  [16])aVar15,0xc9);
    auVar9 = vshufps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0xc9);
    auVar16._0_4_ = aVar15._0_4_ * auVar9._0_4_;
    auVar16._4_4_ = aVar15._4_4_ * auVar9._4_4_;
    auVar16._8_4_ = aVar15._8_4_ * auVar9._8_4_;
    auVar16._12_4_ = aVar15._12_4_ * auVar9._12_4_;
    auVar13 = vfmsub231ps_fma(auVar16,(undefined1  [16])aVar11,auVar13);
  }
  auVar9 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vdpps_avx(auVar9,auVar9,0x7f);
  auVar8 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar13._0_4_));
  fVar22 = auVar8._0_4_;
  fVar22 = fVar22 * 1.5 + auVar13._0_4_ * -0.5 * fVar22 * fVar22 * fVar22;
  fVar17 = fVar22 * auVar9._0_4_;
  fVar20 = fVar22 * auVar9._4_4_;
  fVar21 = fVar22 * auVar9._8_4_;
  fVar22 = fVar22 * auVar9._12_4_;
LAB_01fb20da:
  (__return_storage_ptr__->vx).field_0 = aVar15;
  (__return_storage_ptr__->vy).field_0.m128[0] = fVar17;
  (__return_storage_ptr__->vy).field_0.m128[1] = fVar20;
  (__return_storage_ptr__->vy).field_0.m128[2] = fVar21;
  (__return_storage_ptr__->vy).field_0.m128[3] = fVar22;
  (__return_storage_ptr__->vz).field_0 = aVar11;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);

        const range<int> tbounds = this->timeSegmentRange(time_range);
        if (tbounds.size() == 0) return frame(axisz);
        
        const size_t itime = (tbounds.begin()+tbounds.end())/2;

        const Vec3fa dir = normalize(computeDirection(primID,itime));
        if (is_finite(dir)) return frame(dir);
        else return LinearSpace3fa(one);
      }